

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O3

void __thiscall
cmSearchPath::AddSuffixes
          (cmSearchPath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *suffixes)

{
  vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_> *this_00;
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer __args;
  string p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_> local_98;
  pointer local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = &this->Paths;
  local_98.
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->Paths).
       super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98.
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->Paths).
       super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98.
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->Paths).
       super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Paths).
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Paths).
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Paths).
  super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = suffixes;
  std::vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::reserve
            (this_00,(((long)(suffixes->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(suffixes->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) + 1) *
                     ((long)local_98.
                            super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_98.
                            super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 6));
  local_80 = local_98.
             super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __args = local_98.
             super__Vector_base<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmsys::SystemTools::ConvertToUnixSlashes(&__args->Path);
      cmsys::SystemTools::ConvertToUnixSlashes(&__args->Prefix);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      pcVar1 = (__args->Path)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar1,pcVar1 + (__args->Path)._M_string_length);
      if ((local_b8._M_string_length != 0) &&
         (local_b8._M_dataplus._M_p[local_b8._M_string_length - 1] != '/')) {
        std::__cxx11::string::append((char *)&local_b8);
      }
      pbVar2 = (local_78->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (__rhs = (local_78->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar2; __rhs = __rhs + 1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,&local_b8,__rhs);
        pcVar1 = (__args->Prefix)._M_dataplus._M_p;
        local_50._M_p = (pointer)&local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + (__args->Prefix)._M_string_length);
        std::vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::
        emplace_back<cmSearchPath::PathWithPrefix>(this_00,(PathWithPrefix *)local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
          operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
        }
      }
      std::vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::
      emplace_back<cmSearchPath::PathWithPrefix>(this_00,__args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      __args = __args + 1;
    } while (__args != local_80);
  }
  std::vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::~vector
            (&local_98);
  return;
}

Assistant:

void cmSearchPath::AddSuffixes(const std::vector<std::string>& suffixes)
{
  std::vector<PathWithPrefix> inPaths;
  inPaths.swap(this->Paths);
  this->Paths.reserve(inPaths.size() * (suffixes.size() + 1));

  for (PathWithPrefix& inPath : inPaths) {
    cmSystemTools::ConvertToUnixSlashes(inPath.Path);
    cmSystemTools::ConvertToUnixSlashes(inPath.Prefix);

    // if *i is only / then do not add a //
    // this will get incorrectly considered a network
    // path on windows and cause huge delays.
    std::string p = inPath.Path;
    if (!p.empty() && p.back() != '/') {
      p += "/";
    }

    // Combine with all the suffixes
    for (std::string const& suffix : suffixes) {
      this->Paths.push_back(PathWithPrefix{ p + suffix, inPath.Prefix });
    }

    // And now the original w/o any suffix
    this->Paths.push_back(std::move(inPath));
  }
}